

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

uint Abc_TtCanonicizeWrap
               (TtCanonicizeFunc func,Abc_TtHieMan_t *p,word *pTruth,int nVars,char *pCanonPerm,
               int flag)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int nWords;
  char pCanonPerm2 [16];
  
  nWords = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    nWords = 1;
  }
  Abc_TtNormalizeSmallTruth(pTruth,nVars);
  iVar1 = Abc_TtCountOnesInTruth(pTruth,nVars);
  if (iVar1 != nWords * 0x20) {
    uVar2 = (*func)(p,pTruth,nVars,pCanonPerm,flag);
    return uVar2;
  }
  Abc_TtCopy(Abc_TtCanonicizeWrap::pTruth2,pTruth,nWords,1);
  uVar2 = (*func)(p,pTruth,nVars,pCanonPerm,flag);
  uVar3 = (*func)(p,Abc_TtCanonicizeWrap::pTruth2,nVars,pCanonPerm2,flag);
  iVar1 = Abc_TtCompareRev(pTruth,Abc_TtCanonicizeWrap::pTruth2,nWords);
  if (0 < iVar1) {
    Abc_TtCopy(pTruth,Abc_TtCanonicizeWrap::pTruth2,nWords,0);
    memcpy(pCanonPerm,pCanonPerm2,(long)nVars);
    uVar2 = uVar3;
  }
  return uVar2;
}

Assistant:

unsigned Abc_TtCanonicizeWrap(TtCanonicizeFunc func, Abc_TtHieMan_t * p, word * pTruth, int nVars, char * pCanonPerm, int flag)
{
    int nWords = Abc_TtWordNum(nVars);
    unsigned uCanonPhase1, uCanonPhase2;
    char pCanonPerm2[16];
    static word pTruth2[1024];

    Abc_TtNormalizeSmallTruth(pTruth, nVars);
    if (Abc_TtCountOnesInTruth(pTruth, nVars) != nWords * 32)
        return func(p, pTruth, nVars, pCanonPerm, flag);
    Abc_TtCopy(pTruth2, pTruth, nWords, 1);
    uCanonPhase1 = func(p, pTruth, nVars, pCanonPerm, flag);
    uCanonPhase2 = func(p, pTruth2, nVars, pCanonPerm2, flag);
    if (Abc_TtCompareRev(pTruth, pTruth2, nWords) <= 0)
        return uCanonPhase1;
    Abc_TtCopy(pTruth, pTruth2, nWords, 0);
    memcpy(pCanonPerm, pCanonPerm2, nVars);
    return uCanonPhase2;
}